

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

st_ptls_salt_t * get_salt(uint32_t protocol_version)

{
  uint32_t protocol_version_local;
  st_ptls_salt_t *local_8;
  
  if (protocol_version == 0xff00001b) {
    local_8 = &get_salt::draft27;
  }
  else if (protocol_version == 0xff00001d) {
    local_8 = &get_salt::current;
  }
  else {
    local_8 = (st_ptls_salt_t *)0x0;
  }
  return local_8;
}

Assistant:

static const struct st_ptls_salt_t *get_salt(uint32_t protocol_version)
{
    static const struct st_ptls_salt_t current = {.initial = {0xaf, 0xbf, 0xec, 0x28, 0x99, 0x93, 0xd2, 0x4c, 0x9e, 0x97,
                                                              0x86, 0xf1, 0x9c, 0x61, 0x11, 0xe0, 0x43, 0x90, 0xa8, 0x99},
                                                  .retry = {.key = {0xcc, 0xce, 0x18, 0x7e, 0xd0, 0x9a, 0x09, 0xd0, 0x57, 0x28,
                                                                    0x15, 0x5a, 0x6c, 0xb9, 0x6b, 0xe1},
                                                            .iv = {0xe5, 0x49, 0x30, 0xf9, 0x7f, 0x21, 0x36, 0xf0, 0x53, 0x0a, 0x8c,
                                                                   0x1c}}},
                                       draft27 = {.initial = {0xc3, 0xee, 0xf7, 0x12, 0xc7, 0x2e, 0xbb, 0x5a, 0x11, 0xa7,
                                                              0xd2, 0x43, 0x2b, 0xb4, 0x63, 0x65, 0xbe, 0xf9, 0xf5, 0x02},
                                                  .retry = {.key = {0x4d, 0x32, 0xec, 0xdb, 0x2a, 0x21, 0x33, 0xc8, 0x41, 0xe4,
                                                                    0x04, 0x3d, 0xf2, 0x7d, 0x44, 0x30},
                                                            .iv = {0x4d, 0x16, 0x11, 0xd0, 0x55, 0x13, 0xa5, 0x52, 0xc5, 0x87, 0xd5,
                                                                   0x75}}};

    switch (protocol_version) {
    case QUICLY_PROTOCOL_VERSION_CURRENT:
        return &current;
    case QUICLY_PROTOCOL_VERSION_DRAFT27:
        return &draft27;
        break;
    default:
        return NULL;
    }
}